

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O2

int ncnn::reduction_post_process<ncnn::post_process_identity<float>>(Mat *a,float coeff,Option *opt)

{
  int i;
  uint uVar1;
  void *pvVar2;
  ulong uVar3;
  void *pvVar4;
  int iVar5;
  ulong uVar6;
  void *pvVar7;
  int _c;
  Mat local_78;
  
  uVar1 = a->dims;
  pvVar2 = (void *)(ulong)uVar1;
  if (uVar1 == 3) {
    iVar5 = a->c;
    uVar1 = a->h * a->w;
    if (iVar5 == 1) {
      pvVar2 = a->data;
      uVar3 = 0;
      uVar6 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar6 = uVar3;
      }
      for (; uVar6 != uVar3; uVar3 = uVar3 + 1) {
        *(float *)((long)pvVar2 + uVar3 * 4) = *(float *)((long)pvVar2 + uVar3 * 4) * coeff;
      }
    }
    else {
      pvVar4 = (void *)0x0;
      pvVar7 = (void *)(ulong)uVar1;
      if ((int)uVar1 < 1) {
        pvVar7 = pvVar4;
      }
      if (iVar5 < 1) {
        iVar5 = 0;
      }
      while (_c = (int)pvVar4, _c != iVar5) {
        Mat::channel(&local_78,a,_c);
        pvVar4 = local_78.data;
        Mat::~Mat(&local_78);
        for (pvVar2 = (void *)0x0; pvVar7 != pvVar2; pvVar2 = (void *)((long)pvVar2 + 1)) {
          *(float *)((long)pvVar4 + (long)pvVar2 * 4) =
               *(float *)((long)pvVar4 + (long)pvVar2 * 4) * coeff;
        }
        pvVar4 = (void *)(ulong)(_c + 1);
      }
    }
  }
  else if (uVar1 == 2) {
    uVar1 = a->h * a->w;
    pvVar7 = a->data;
    pvVar4 = (void *)0x0;
    pvVar2 = (void *)(ulong)uVar1;
    if ((int)uVar1 < 1) {
      pvVar2 = pvVar4;
    }
    for (; pvVar2 != pvVar4; pvVar4 = (void *)((long)pvVar4 + 1)) {
      *(float *)((long)pvVar7 + (long)pvVar4 * 4) =
           *(float *)((long)pvVar7 + (long)pvVar4 * 4) * coeff;
    }
  }
  else if (uVar1 == 1) {
    pvVar7 = a->data;
    pvVar4 = (void *)0x0;
    pvVar2 = (void *)(ulong)(uint)a->w;
    if (a->w < 1) {
      pvVar2 = pvVar4;
    }
    for (; pvVar2 != pvVar4; pvVar4 = (void *)((long)pvVar4 + 1)) {
      *(float *)((long)pvVar7 + (long)pvVar4 * 4) =
           *(float *)((long)pvVar7 + (long)pvVar4 * 4) * coeff;
    }
  }
  return (int)pvVar2;
}

Assistant:

static int reduction_post_process(Mat& a, float coeff, const Option& opt)
{
    MathOp mathop;

    int dims = a.dims;
    if (dims == 1)
    {
        int w = a.w;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < w; i++)
            a[i] = mathop(a[i]) * coeff;
    }
    else if (dims == 2)
    {
        int size = a.w * a.h;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < size; i++)
            a[i] = mathop(a[i]) * coeff;
    }
    else if (dims == 3)
    {
        int c = a.c;
        int size = a.w * a.h;
        if (c == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < size; i++)
                a[i] = mathop(a[i]) * coeff;
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < c; q++)
            {
                float* outptr = a.channel(q);
                for (int i = 0; i < size; i++)
                    outptr[i] = mathop(outptr[i]) * coeff;
            }
        }
    }

    return 0;
}